

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expr.hpp
# Opt level: O3

ostream * viennamath::operator<<
                    (ostream *stream,rt_vector_expr<viennamath::rt_expression_interface<double>_> *e
                    )

{
  ostream *poVar1;
  ulong uVar2;
  pointer prVar3;
  long lVar4;
  ulong uVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"[",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"](",2);
  prVar3 = (e->
           super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
           ).
           super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((e->
      super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
      ).
      super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != prVar3) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      operator<<(stream,(rt_expr<viennamath::rt_expression_interface<double>_> *)
                        ((long)&(prVar3->rt_expr_)._M_ptr + lVar4));
      uVar5 = uVar5 + 1;
      prVar3 = (e->
               super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
               ).
               super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar2 = (long)(e->
                    super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                    ).
                    super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)prVar3 >> 3;
      if (uVar5 < uVar2) {
        std::__ostream_insert<char,std::char_traits<char>>(stream,", ",2);
        prVar3 = (e->
                 super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                 ).
                 super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar2 = (long)(e->
                      super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                      ).
                      super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)prVar3 >> 3;
      }
      lVar4 = lVar4 + 8;
    } while (uVar5 < uVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,")",1);
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream & stream, rt_vector_expr<InterfaceType> const & e)
  {
    stream << "[" << e.size() << "](";
    for (std::size_t i=0; i<e.size(); ++i)
    {
      stream << e[i];
      if (i+1 < e.size())
        stream << ", ";
    }
    stream << ")";

    return stream;
  }